

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

boolean corpse_chance(monst *mon,monst *magr,boolean was_swallowed)

{
  int *piVar1;
  int iVar2;
  permonst *pm;
  long lVar3;
  byte bVar4;
  boolean bVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  obj *poVar9;
  uint uVar10;
  char *line;
  char kbuf [256];
  
  pm = mon->data;
  if ((pm == mons + 0xea) || (pm == mons + 0xdb || pm->mlet == '&')) {
    if (was_swallowed != '\0') {
      return '\0';
    }
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      return '\0';
    }
    pcVar7 = Monnam(mon);
    pcVar7 = s_suffix(pcVar7);
    line = "%s body crumbles into dust.";
    goto LAB_001de120;
  }
  lVar3 = 4;
  do {
    lVar8 = lVar3;
    if (lVar8 == 10) {
      bVar5 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
      if (bVar5 != '\0') {
        return '\0';
      }
      if (((((level->flags).field_0xa & 1) != 0) && ((pm->mflags2 & 2) != 0)) &&
         (uVar10 = mt_random(), uVar10 % 3 != 0)) {
        return '\0';
      }
      if (pm == mons + 0x154 || 2 < pm->msize) {
        return '\x01';
      }
      if (pm->mlet != '7') {
        if ((pm != mons + 0x145 && (pm != mons + 0x146 && pm != mons + 0x144)) &&
            (mons + 0x168 < pm || pm < mons + 0x159)) {
          iVar6 = rn2((pm->msize == 0) + 2 + (uint)((pm->geno & 6) == 0));
          return iVar6 == 0;
        }
        return '\x01';
      }
      return '\x01';
    }
    lVar3 = lVar8 + 1;
  } while (pm->mattk[lVar8 + -4].aatyp != '\x0e');
  bVar4 = pm->mattk[lVar8 + -4].damn;
  uVar10 = (uint)bVar4;
  if (bVar4 == 0) {
    bVar4 = pm->mattk[lVar8 + -4].damd;
    if (bVar4 != 0) {
      uVar10 = (int)pm->mlevel + 1;
      goto LAB_001de283;
    }
    iVar6 = 0;
  }
  else {
    bVar4 = pm->mattk[lVar8 + -4].damd;
LAB_001de283:
    iVar6 = dice(uVar10,(uint)bVar4);
  }
  if (magr == (monst *)0x0 || was_swallowed == '\0') {
    pcVar7 = mons_mname(pm);
    pcVar7 = s_suffix(pcVar7);
    sprintf(kbuf,"%s explosion",pcVar7);
    killer_format = 0;
    killer = kbuf;
    explode((int)mon->mx,(int)mon->my,-1,iVar6,'\x14',1);
    return '\0';
  }
  if (magr == &youmonst) {
    pcVar7 = body_part(0x12);
    pline("There is an explosion in your %s!",pcVar7);
    pcVar7 = mons_mname(pm);
    pcVar7 = s_suffix(pcVar7);
    sprintf(kbuf,"%s explosion",pcVar7);
    if (u.uprops[0x33].extrinsic != 0 || u.uprops[0x33].intrinsic != 0) {
      iVar6 = (iVar6 + 1) / 2;
    }
    losehp(iVar6,kbuf,0);
    return '\0';
  }
  if (flags.soundok != '\0') {
    You_hear("an explosion.");
  }
  piVar1 = &magr->mhp;
  iVar2 = *piVar1;
  *piVar1 = *piVar1 - iVar6;
  if ((*piVar1 != 0 && SBORROW4(iVar2,iVar6) == *piVar1 < 0) || (mondied(magr), 0 < magr->mhp)) {
    if (magr->wormno == '\0') {
      if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001de435;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001de42c;
        }
        else {
LAB_001de42c:
          if (ublindf == (obj *)0x0) {
            return '\0';
          }
LAB_001de435:
          if (ublindf->oartifact != '\x1d') {
            return '\0';
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return '\0';
        }
        if ((viz_array[magr->my][magr->mx] & 1U) == 0) {
          return '\0';
        }
        if ((magr->data->mflags3 & 0x200) == 0) {
          return '\0';
        }
      }
    }
    else {
      bVar5 = worm_known(level,magr);
      if (bVar5 == '\0') {
        return '\0';
      }
    }
    uVar10 = *(uint *)&magr->field_0x60;
    if ((((uVar10 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar10 & 0x280) != 0) {
        return '\0';
      }
    }
    else {
      if ((uVar10 & 0x280) != 0) {
        return '\0';
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return '\0';
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return '\0';
    }
    pcVar7 = Monnam(magr);
    line = "%s seems to have indigestion.";
    goto LAB_001de120;
  }
  if (magr->wormno == '\0') {
    if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001de57e;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001de575;
      }
      else {
LAB_001de575:
        if (ublindf == (obj *)0x0) goto LAB_001de62c;
LAB_001de57e:
        if (ublindf->oartifact != '\x1d') goto LAB_001de62c;
      }
      if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[magr->my][magr->mx] & 1U) == 0 || ((magr->data->mflags3 & 0x200) == 0))))
      goto LAB_001de62c;
    }
LAB_001de5d9:
    uVar10 = *(uint *)&magr->field_0x60;
    if ((((uVar10 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar10 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001de61f;
      goto LAB_001de62c;
    }
    if ((uVar10 & 0x280) != 0) goto LAB_001de62c;
LAB_001de61f:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001de62c;
  }
  else {
    bVar5 = worm_known(level,magr);
    if (bVar5 != '\0') goto LAB_001de5d9;
LAB_001de62c:
    if (((magr->data->mflags1 & 0x10000) == 0) &&
       ((poVar9 = which_armor(magr,4), poVar9 == (obj *)0x0 ||
        (poVar9 = which_armor(magr,4), poVar9->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001de680;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001de67b;
      }
      else {
LAB_001de67b:
        if (ublindf != (obj *)0x0) {
LAB_001de680:
          if (ublindf->oartifact == '\x1d') goto LAB_001de713;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001de77e;
      }
LAB_001de713:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar6 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy), iVar6 < 0x41))))
      goto LAB_001de77e;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar5 = match_warn_of_mon(magr), bVar5 == '\0')))) {
      return '\0';
    }
  }
LAB_001de77e:
  pcVar7 = Monnam(magr);
  line = "%s rips open!";
LAB_001de120:
  pline(line,pcVar7);
  return '\0';
}

Assistant:

boolean corpse_chance(struct monst *mon, 
		      struct monst *magr,	/* killer, if swallowed */
		      boolean was_swallowed)	/* digestion */
{
	const struct permonst *mdat = mon->data;
	int i, tmp;
	char kbuf[BUFSZ];

	if (mdat == &mons[PM_VLAD_THE_IMPALER] || mdat->mlet == S_LICH ||
	    mdat == &mons[PM_DISINTEGRATOR]) {
	    if (cansee(mon->mx, mon->my) && !was_swallowed)
		pline("%s body crumbles into dust.", s_suffix(Monnam(mon)));
	    return FALSE;
	}

	/* Gas spores always explode upon death */
	for (i = 0; i < NATTK; i++) {
	    if (mdat->mattk[i].aatyp == AT_BOOM) {
		if (mdat->mattk[i].damn)
		    tmp = dice((int)mdat->mattk[i].damn,
				(int)mdat->mattk[i].damd);
		else if (mdat->mattk[i].damd)
		    tmp = dice((int)mdat->mlevel+1, (int)mdat->mattk[i].damd);
		else tmp = 0;
		if (was_swallowed && magr) {
		    if (magr == &youmonst) {
			pline("There is an explosion in your %s!",
			      body_part(STOMACH));
			sprintf(kbuf, "%s explosion",
				s_suffix(mons_mname(mdat)));
			if (Half_physical_damage) tmp = (tmp+1) / 2;
			losehp(tmp, kbuf, KILLED_BY_AN);
		    } else {
			if (flags.soundok) You_hear("an explosion.");
			magr->mhp -= tmp;
			if (magr->mhp < 1) mondied(magr);
			if (magr->mhp < 1) { /* maybe lifesaved */
			    if (canspotmon(level, magr))
				pline("%s rips open!", Monnam(magr));
			} else if (canseemon(level, magr))
			    pline("%s seems to have indigestion.",
				  Monnam(magr));
		    }

		    return FALSE;
		}

		sprintf(kbuf, "%s explosion", s_suffix(mons_mname(mdat)));
		killer = kbuf;
		killer_format = KILLED_BY_AN;
		explode(mon->mx, mon->my, -1, tmp, MON_EXPLODE, EXPL_NOXIOUS);
		return FALSE;
	    }
	}

	/* must duplicate this below check in xkilled() since it results in
	 * creating no objects as well as no corpse
	 */
	if (LEVEL_SPECIFIC_NOCORPSE(mdat))
		return FALSE;

	if (bigmonst(mdat) || mdat == &mons[PM_LIZARD]
		   || is_golem(mdat)
		   || is_mplayer(mdat)
		   || is_rider(mdat))
		return TRUE;
	return (boolean) (!rn2((int)
		(2 + ((int)(mdat->geno & G_FREQ)<2) + verysmall(mdat))));
}